

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall
cs_impl::any::make<std::pair<cs_impl::any,cs_impl::any>,cs_impl::any,cs_impl::any>
          (any *this,any *args,any *args_1)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_002570e8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<bool>::allocator + DAT_002570e8 * 8);
    DAT_002570e8 = DAT_002570e8 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_0024d5a8;
  pbVar1[1]._vptr_baseHolder = (_func_int **)0x0;
  pbVar1[1]._vptr_baseHolder = (_func_int **)args->mDat;
  args->mDat = (proxy *)0x0;
  pbVar1[2]._vptr_baseHolder = (_func_int **)0x0;
  pbVar1[2]._vptr_baseHolder = (_func_int **)args_1->mDat;
  args_1->mDat = (proxy *)0x0;
  if ((DAT_00258550 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00258550];
    DAT_00258550 = DAT_00258550 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}